

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O3

void __thiscall lsim::gui::CircuitEditor::draw_grid(CircuitEditor *this,ImDrawList *draw_list)

{
  ImVec2 IVar1;
  float fVar2;
  Point win_pos;
  Point local_88;
  Point local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  Point local_60;
  Point local_58;
  undefined8 uStack_50;
  CircuitEditor *local_48;
  Point local_40;
  Point local_38;
  
  if (this->m_show_grid == true) {
    IVar1 = ImGui::GetCursorScreenPos();
    Point::Point(&local_60,IVar1.x,IVar1.y);
    IVar1 = ImGui::GetWindowSize();
    Point::Point(&local_88,IVar1.x,IVar1.y);
    local_58 = local_88;
    uStack_50 = 0;
    fVar2 = fmodf((this->m_scroll_delta).x,10.0);
    if (local_58.x <= fVar2) {
      local_78 = local_58.y;
      fStack_74 = local_58.y;
      fStack_70 = local_58.y;
      fStack_6c = local_58.y;
    }
    else {
      local_78 = local_58.y;
      fStack_74 = local_58.y;
      fStack_70 = local_58.y;
      fStack_6c = local_58.y;
      local_48 = this;
      do {
        Point::Point(&local_38,fVar2,0.0);
        local_88 = Point::operator+(&local_38,&local_60);
        Point::Point(&local_40,fVar2,local_78);
        local_80 = Point::operator+(&local_40,&local_60);
        ImDrawList::AddLine(draw_list,(ImVec2 *)&local_88,(ImVec2 *)&local_80,0x28c8c8c8,1.0);
        fVar2 = fVar2 + 10.0;
        this = local_48;
      } while (fVar2 < local_58.x);
    }
    fVar2 = fmodf((this->m_scroll_delta).y,10.0);
    if (fVar2 < local_78) {
      do {
        Point::Point(&local_38,0.0,fVar2);
        local_88 = Point::operator+(&local_38,&local_60);
        Point::Point(&local_40,local_58.x,fVar2);
        local_80 = Point::operator+(&local_40,&local_60);
        ImDrawList::AddLine(draw_list,(ImVec2 *)&local_88,(ImVec2 *)&local_80,0x28c8c8c8,1.0);
        fVar2 = fVar2 + 10.0;
      } while (fVar2 < local_78);
    }
  }
  return;
}

Assistant:

void CircuitEditor::draw_grid(ImDrawList *draw_list) {
	if (!m_show_grid) {
		return;
	}

	Point win_pos = ImGui::GetCursorScreenPos();
	Point win_size = ImGui::GetWindowSize();

	for (float x = fmodf(m_scroll_delta.x, GRID_SIZE); x < win_size.x; x += GRID_SIZE) {		// NOLINT
		draw_list->AddLine(Point(x, 0.0f) + win_pos, Point(x, win_size.y) + win_pos, COLOR_GRID_LINE);
	}

	for (float y = fmodf(m_scroll_delta.y, GRID_SIZE); y < win_size.y; y += GRID_SIZE) {		// NOLINT
		draw_list->AddLine(Point(0.0f, y) + win_pos, Point(win_size.x, y) + win_pos, COLOR_GRID_LINE);
	}
}